

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O1

art_ref_t art_find_child(art_inner_node_t *node,art_typecode_t typecode,art_key_chunk_t key_chunk)

{
  art_inner_node_t *paVar1;
  undefined7 in_register_00000031;
  ulong uVar2;
  
  switch((int)CONCAT71(in_register_00000031,typecode)) {
  case 2:
    if ((ulong)node[1].prefix_size != 0) {
      paVar1 = (art_inner_node_t *)(node[2].prefix + 3);
      uVar2 = 0;
      while (node[1].prefix[uVar2] != key_chunk) {
        uVar2 = uVar2 + 1;
        paVar1 = (art_inner_node_t *)(paVar1[1].prefix + 1);
        if (node[1].prefix_size == uVar2) {
          return 0;
        }
      }
      goto LAB_00111673;
    }
    break;
  case 3:
    if ((ulong)node[1].prefix_size != 0) {
      paVar1 = node + 4;
      uVar2 = 0;
      while (node[1].prefix[uVar2] != key_chunk) {
        uVar2 = uVar2 + 1;
        paVar1 = (art_inner_node_t *)(paVar1[1].prefix + 1);
        if (node[1].prefix_size == uVar2) {
          return 0;
        }
      }
      goto LAB_00111673;
    }
    break;
  case 4:
    if ((ulong)node[2].prefix[(ulong)key_chunk + 3] == 0x30) {
      return 0;
    }
    paVar1 = (art_inner_node_t *)
             ((long)node + (ulong)node[2].prefix[(ulong)key_chunk + 3] * 8 + 0x110);
    goto LAB_00111673;
  case 5:
    paVar1 = (art_inner_node_t *)((long)node + (ulong)key_chunk * 8 + 8);
LAB_00111673:
    return *(art_ref_t *)paVar1;
  }
  return 0;
}

Assistant:

static art_ref_t art_find_child(const art_inner_node_t *node,
                                art_typecode_t typecode,
                                art_key_chunk_t key_chunk) {
    switch (typecode) {
        case CROARING_ART_NODE4_TYPE:
            return art_node4_find_child((art_node4_t *)node, key_chunk);
        case CROARING_ART_NODE16_TYPE:
            return art_node16_find_child((art_node16_t *)node, key_chunk);
        case CROARING_ART_NODE48_TYPE:
            return art_node48_find_child((art_node48_t *)node, key_chunk);
        case CROARING_ART_NODE256_TYPE:
            return art_node256_find_child((art_node256_t *)node, key_chunk);
        default:
            assert(false);
            return CROARING_ART_NULL_REF;
    }
}